

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicLattice.cpp
# Opt level: O1

void __thiscall CubicLattice::createUpEdgesMap(CubicLattice *this)

{
  double dVar1;
  int iVar2;
  iterator iVar3;
  pointer pvVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  pointer __x;
  long *plVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vvint vertexToUpEdges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directionList;
  int local_17c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_178;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  long *local_78 [2];
  long local_68 [2];
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_158._0_8_ = local_158 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"xyz","");
  local_138._0_8_ = local_138 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"xy","");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"xz","");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"yz","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-xyz","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"-xy","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"-xz","");
  plVar8 = local_68;
  local_78[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"-yz","");
  __l._M_len = 8;
  __l._M_array = (iterator)local_158;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,(allocator_type *)&local_178);
  lVar7 = -0x100;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  local_50 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_58 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
                *)&(this->super_Lattice).upEdgesMap;
    __x = local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_178.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_178.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      dVar1 = pow((double)(this->super_Lattice).l,3.0);
      local_158._16_8_ = 0;
      local_158._0_8_ = (pointer)0x0;
      local_158._8_8_ = 0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::_M_fill_assign(&local_178,
                       (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1,
                       (value_type *)local_158);
      if ((pointer)local_158._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
      }
      dVar1 = pow((double)(this->super_Lattice).l,3.0);
      if (0.0 < dVar1) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          iVar2 = std::__cxx11::string::compare((char *)__x);
          pvVar4 = local_178.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (iVar2 == 0) {
            local_158._0_8_ = local_158 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"x","");
            local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                  (this,uVar6,
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                    *)local_158,1);
            iVar3._M_current =
                 *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish + lVar7);
            if (iVar3._M_current ==
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + lVar7)) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
            }
            else {
              *iVar3._M_current = local_17c;
              *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
            }
            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
            }
            pvVar4 = local_178.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_158._0_8_ = local_158 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"y","");
            local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                  (this,uVar6,
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                    *)local_158,1);
            iVar3._M_current =
                 *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish + lVar7);
            if (iVar3._M_current ==
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + lVar7)) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
            }
            else {
              *iVar3._M_current = local_17c;
              *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
            }
            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
            }
            pvVar4 = local_178.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_158._0_8_ = local_158 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"z","");
            local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                  (this,uVar6,
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                    *)local_158,1);
            iVar3._M_current =
                 *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish + lVar7);
            if (iVar3._M_current ==
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + lVar7)) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
            }
            else {
LAB_0013383c:
              *iVar3._M_current = local_17c;
              *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
            }
LAB_00133847:
            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
            }
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)__x);
            pvVar4 = local_178.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (iVar2 == 0) {
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"x","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,1);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"y","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,1);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"z","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,0xffffffff);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current !=
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7))
              goto LAB_0013383c;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              goto LAB_00133847;
            }
            iVar2 = std::__cxx11::string::compare((char *)__x);
            pvVar4 = local_178.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (iVar2 == 0) {
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"x","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,1);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"y","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,0xffffffff);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"z","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,1);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current !=
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7))
              goto LAB_0013383c;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              goto LAB_00133847;
            }
            iVar2 = std::__cxx11::string::compare((char *)__x);
            pvVar4 = local_178.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (iVar2 == 0) {
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"x","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,0xffffffff);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"y","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,1);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"z","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,1);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current !=
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7))
              goto LAB_0013383c;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              goto LAB_00133847;
            }
            iVar2 = std::__cxx11::string::compare((char *)__x);
            pvVar4 = local_178.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (iVar2 == 0) {
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"x","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,0xffffffff);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"y","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,0xffffffff);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"z","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,0xffffffff);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current !=
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7))
              goto LAB_0013383c;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              goto LAB_00133847;
            }
            iVar2 = std::__cxx11::string::compare((char *)__x);
            pvVar4 = local_178.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (iVar2 == 0) {
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"x","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,0xffffffff);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"y","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,0xffffffff);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"z","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,1);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current !=
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7))
              goto LAB_0013383c;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              goto LAB_00133847;
            }
            iVar2 = std::__cxx11::string::compare((char *)__x);
            pvVar4 = local_178.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (iVar2 == 0) {
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"x","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,0xffffffff);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"y","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,1);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"z","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,0xffffffff);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current !=
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7))
              goto LAB_0013383c;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              goto LAB_00133847;
            }
            iVar2 = std::__cxx11::string::compare((char *)__x);
            pvVar4 = local_178.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (iVar2 == 0) {
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"x","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,1);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"y","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,0xffffffff);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current ==
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7)) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              }
              else {
                *iVar3._M_current = local_17c;
                *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish + lVar7) = iVar3._M_current + 1;
              }
              if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
              }
              pvVar4 = local_178.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_158._0_8_ = local_158 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"z","");
              local_17c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar6,
                                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)local_158,0xffffffff);
              iVar3._M_current =
                   *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar7);
              if (iVar3._M_current !=
                  *(int **)((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + lVar7))
              goto LAB_0013383c;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)
                         ((long)&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar7),iVar3,&local_17c);
              goto LAB_00133847;
            }
          }
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
          dVar1 = pow((double)(this->super_Lattice).l,3.0);
          lVar7 = lVar7 + 0x18;
        } while ((double)(int)uVar5 < dVar1);
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
      ::
      pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                  *)local_158,__x,&local_178);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
      ::
      _M_emplace_unique<std::pair<std::__cxx11::string,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
                (local_58,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                           *)local_158);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_138);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_178);
      __x = __x + 1;
    } while (__x != local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CubicLattice::createUpEdgesMap()
{
    std::vector<std::string> directionList = {"xyz", "xy", "xz", "yz",
                                              "-xyz", "-xy", "-xz", "-yz"};
    for (const auto &direction : directionList)
    {
        vvint vertexToUpEdges;
        vertexToUpEdges.assign(pow(l, 3), {});
        for (int vertexIndex = 0; vertexIndex < pow(l, 3); ++vertexIndex)
        {
            // cartesian4 coordinate = indexToCoordinate(vertexIndex);
            if (direction == "xyz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", 1));
                }
                catch(const std::invalid_argument& e)
                {
                    // Edge to vertex outside lattice
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "xy")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "xz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "yz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "-xyz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "-xy")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "-xz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
            else if (direction == "-yz")
            {
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "x", 1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "y", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
                try
                {
                    vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "z", -1));
                }
                catch(const std::invalid_argument& e)
                {
                }
            }
        }
        upEdgesMap.insert(std::pair<std::string, vvint>(direction, vertexToUpEdges));
    }
}